

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::CompareOperator<float>::doApply
          (Interval *__return_storage_ptr__,CompareOperator<float> *this,EvalContext *param_1,
          IArgs *iargs)

{
  Interval *pIVar1;
  Interval *pIVar2;
  char cVar3;
  
  pIVar1 = iargs->a;
  pIVar2 = iargs->b;
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  cVar3 = (**(code **)(*(long *)this + 0x60))(this,pIVar1,pIVar2);
  if (cVar3 != '\0') {
    __return_storage_ptr__->m_hasNaN = false;
    __return_storage_ptr__->m_lo = 1.0;
    __return_storage_ptr__->m_hi = 1.0;
  }
  cVar3 = (**(code **)(*(long *)this + 0x68))(this,pIVar1,pIVar2);
  if (cVar3 != '\0') {
    __return_storage_ptr__->m_lo =
         (double)(-(ulong)(__return_storage_ptr__->m_lo <= 0.0) &
                 (ulong)__return_storage_ptr__->m_lo);
    __return_storage_ptr__->m_hi =
         (double)(-(ulong)(0.0 <= __return_storage_ptr__->m_hi) &
                 (ulong)__return_storage_ptr__->m_hi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		doApply	(const EvalContext&, const IArgs& iargs) const
	{
		const IArg0&	arg0 = iargs.a;
		const IArg1&	arg1 = iargs.b;
		IRet	ret;

		if (canSucceed(arg0, arg1))
			ret |= true;
		if (canFail(arg0, arg1))
			ret |= false;

		return ret;
	}